

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_test.cpp
# Opt level: O1

void __thiscall
check_computations_of_scalar_product::test_method(check_computations_of_scalar_product *this)

{
  double a;
  Persistence_landscape q;
  Persistence_landscape p;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag2;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag;
  undefined1 local_90 [40];
  undefined1 local_68 [40];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_40;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_28;
  
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"data/file_with_diagram","");
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            (&local_28,(string *)local_68,-1,-1.0);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)local_68,&local_28,0xffffffffffffffff);
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"data/file_with_diagram_1","");
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            (&local_40,(string *)local_90,-1,-1.0);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)local_90,&local_40,0xffffffffffffffff);
  a = Gudhi::Persistence_representations::compute_inner_product
                ((Persistence_landscape *)local_68,(Persistence_landscape *)local_90);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(a,0.754498,epsilon);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             *)local_90);
  if (local_40.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             *)local_68);
  if (local_28.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_computations_of_distances) {
  std::vector<std::pair<double, double> > diag =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram");
  Persistence_landscape p(diag);
  std::vector<std::pair<double, double> > diag2 =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram_1");
  Persistence_landscape q(diag2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q), 25.5824, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, 2), 2.1264, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, std::numeric_limits<double>::max()), 0.359068, epsilon);
}